

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-danger.c
# Opt level: O1

wchar_t borg_danger(wchar_t y,wchar_t x,wchar_t c,_Bool average,_Bool full_damage)

{
  chunk_conflict *c_00;
  _Bool _Var1;
  loc lVar2;
  wchar_t wVar3;
  long lVar4;
  long lVar5;
  wchar_t wVar6;
  
  lVar2 = (loc)loc(x,y);
  _Var1 = square_in_bounds(cave,lVar2);
  if (_Var1) {
    _Var1 = square_isvault(cave,lVar2);
    c_00 = cave;
    wVar3 = L'\0';
    if ((!_Var1) && (wVar3 = L'\0', borg.trait[0x69] < 0x51)) {
      wVar3 = (uint)borg_fear_region[y / 0xb][x / 0xb] * c;
    }
    wVar6 = L'Ĭ';
    if (wVar3 < L'Ĭ') {
      wVar6 = wVar3;
    }
    if (borg.trait[0x69] != 100) {
      wVar6 = wVar3;
    }
    if (borg.time_this_panel < 0xc9) {
      lVar2 = (loc)loc(x,y);
      _Var1 = square_isvault(c_00,lVar2);
      if (!_Var1) {
        wVar6 = wVar6 + (uint)borg_fear_monsters[y][x] * c;
      }
    }
    if (1 < borg_kills_nxt) {
      lVar5 = 1;
      lVar4 = 0x1d8;
      do {
        if (*(short *)(borg_kills->spell + lVar4 + -0x19) != 0) {
          wVar3 = borg_danger_one_kill(y,x,c,(wchar_t)lVar5,average,true);
          wVar6 = wVar6 + wVar3;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x1d8;
      } while (lVar5 < borg_kills_nxt);
    }
    wVar3 = L'ߐ';
    if (wVar6 < L'ߐ') {
      wVar3 = wVar6;
    }
  }
  else {
    wVar3 = L'ߐ';
  }
  return wVar3;
}

Assistant:

int borg_danger(int y, int x, int c, bool average, bool full_damage)
{
    int i, p = 0;

    struct loc l = loc(x, y);
    if (!square_in_bounds(cave, l))
        return 2000;

    /* Base danger (from regional fear) but not within a vault.  Cheating the
     * floor grid */
    if (!square_isvault(cave, l) && borg.trait[BI_CDEPTH] <= 80) {
        p += borg_fear_region[y / 11][x / 11] * c;
    }

    /* Reduce regional fear on Depth 100 */
    if (borg.trait[BI_CDEPTH] == 100 && p >= 300)
        p = 300;

    /* Added danger (from a lot of monsters).
     * But do not add it if we have been sitting on
     * this panel for too long, or monster's in a vault.  The fear_monsters[][]
     * can induce some bouncy behavior.
     */
    if (borg.time_this_panel <= 200 && !square_isvault(cave, loc(x, y)))
        p += borg_fear_monsters[y][x] * c;

    full_damage = true;

    /* Examine all the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Collect danger from monster */
        p += borg_danger_one_kill(y, x, c, i, average, full_damage);
    }

    /* Return the danger */
    return (p > 2000 ? 2000 : p);
}